

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgflusher.cc
# Opt level: O1

void bgflusher_shutdown(void)

{
  avl_node *node;
  avl_node *paVar1;
  ulong uVar2;
  void *ret;
  void *pvStack_28;
  
  if (bgflusher_tids != (pthread_t *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&sync_mutex);
    bgflusher_terminate_signal = '\x01';
    pthread_cond_broadcast((pthread_cond_t *)&sync_cond);
    pthread_mutex_unlock((pthread_mutex_t *)&sync_mutex);
    if (num_bgflusher_threads != 0) {
      uVar2 = 0;
      do {
        pthread_join(bgflusher_tids[uVar2],&pvStack_28);
        uVar2 = uVar2 + 1;
      } while (uVar2 < num_bgflusher_threads);
    }
    free(bgflusher_tids);
    bgflusher_tids = (pthread_t *)0x0;
    pthread_mutex_lock((pthread_mutex_t *)&bgf_lock);
    node = avl_first(&openfiles);
    while (node != (avl_node *)0x0) {
      paVar1 = avl_next(node);
      avl_remove(&openfiles,node);
      free(node + -0x36);
      node = paVar1;
    }
    bgflusher_initialized = '\0';
    pthread_mutex_destroy((pthread_mutex_t *)&sync_mutex);
    pthread_cond_destroy((pthread_cond_t *)&sync_cond);
    pthread_mutex_unlock((pthread_mutex_t *)&bgf_lock);
    pthread_mutex_destroy((pthread_mutex_t *)&bgf_lock);
  }
  return;
}

Assistant:

void bgflusher_shutdown()
{
    void *ret;
    struct avl_node *a = NULL;
    struct openfiles_elem *elem;

    if (!bgflusher_tids) {
        return;
    }

    // set terminate signal
    mutex_lock(&sync_mutex);
    bgflusher_terminate_signal = 1;
    thread_cond_broadcast(&sync_cond);
    mutex_unlock(&sync_mutex);

    for (size_t i = 0; i < num_bgflusher_threads; ++i) {
        thread_join(bgflusher_tids[i], &ret);
    }
    free(bgflusher_tids);
    bgflusher_tids = NULL;

    mutex_lock(&bgf_lock);
    // free all elems in the tree
    a = avl_first(&openfiles);
    while (a) {
        elem = _get_entry(a, struct openfiles_elem, avl);
        a = avl_next(a);

        avl_remove(&openfiles, &elem->avl);
        free(elem);
    }

    sleep_duration = FDB_BGFLUSHER_SLEEP_DURATION;
    bgflusher_initialized = 0;
    mutex_destroy(&sync_mutex);
    thread_cond_destroy(&sync_cond);
    mutex_unlock(&bgf_lock);

    mutex_destroy(&bgf_lock);
}